

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O2

void Bbl_ManSortCubes(char **pCubes,int nCubes,int nVars)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  iVar2 = 1;
  if (1 < nCubes) {
    iVar2 = nCubes;
  }
  uVar7 = 1;
  for (uVar5 = 0; uVar5 != iVar2 - 1; uVar5 = uVar5 + 1) {
    uVar9 = uVar5 & 0xffffffff;
    uVar6 = uVar7;
    while( true ) {
      uVar8 = (uint)uVar9;
      if ((uint)nCubes == uVar6) break;
      iVar3 = memcmp(pCubes[uVar6],pCubes[(int)uVar8],(long)nVars);
      uVar4 = (uint)uVar6;
      if (-1 < iVar3) {
        uVar4 = uVar8;
      }
      uVar6 = uVar6 + 1;
      uVar9 = (ulong)uVar4;
    }
    pcVar1 = pCubes[uVar5];
    pCubes[uVar5] = pCubes[(int)uVar8];
    pCubes[(int)uVar8] = pcVar1;
    uVar7 = uVar7 + 1;
  }
  return;
}

Assistant:

void Bbl_ManSortCubes( char ** pCubes, int nCubes, int nVars )
{
    char * pTemp;
    int i, j, best_i;
    for ( i = 0; i < nCubes-1; i++ )
    {
        best_i = i;
        for (j = i+1; j < nCubes; j++)
            if ( memcmp( pCubes[j], pCubes[best_i], (size_t)nVars ) < 0 )
                best_i = j;
        pTemp = pCubes[i]; pCubes[i] = pCubes[best_i]; pCubes[best_i] = pTemp;
    }
}